

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::addCommandBufferInfo
          (CLIntercept *this,cl_command_buffer_khr cmdbuf,cl_command_queue queue)

{
  mutex *__mutex;
  mapped_type p_Var1;
  int iVar2;
  mapped_type *pp_Var3;
  undefined8 uVar4;
  cl_device_id device;
  cl_platform_id platform;
  cl_command_buffer_khr local_30;
  cl_device_id local_28;
  mapped_type local_20;
  
  if (cmdbuf != (cl_command_buffer_khr)0x0) {
    __mutex = &this->m_Mutex;
    local_30 = cmdbuf;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      uVar4 = std::__throw_system_error(iVar2);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar4);
    }
    local_28 = (cl_device_id)0x0;
    (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1091,8,&local_28,(size_t *)0x0);
    local_20 = (mapped_type)0x0;
    (*(this->m_Dispatch).clGetDeviceInfo)(local_28,0x1031,8,&local_20,(size_t *)0x0);
    p_Var1 = local_20;
    pp_Var3 = std::
              map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
              ::operator[](&this->m_CommandBufferInfoMap,&local_30);
    *pp_Var3 = p_Var1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void CLIntercept::addCommandBufferInfo(
    cl_command_buffer_khr cmdbuf,
    cl_command_queue queue )
{
    if( cmdbuf )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        m_CommandBufferInfoMap[cmdbuf] = getPlatform(queue);
    }
}